

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryNumericDivideWrapper,duckdb::DivideOperator,bool,true,false>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  ValidityMask *pVVar1;
  bool bVar2;
  char cVar3;
  idx_t idx;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined1 *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  char rentry_2;
  char lentry_2;
  idx_t i;
  char rentry_1;
  char lentry_1;
  idx_t start;
  char rentry;
  char lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_ffffffffffffff80;
  ulong uVar4;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  idx_t local_70;
  ValidityMask *local_68;
  undefined1 local_5a;
  undefined1 local_59;
  ValidityMask *local_58;
  unsigned_long local_50;
  ulong local_48;
  idx_t in_stack_ffffffffffffffc0;
  ValidityMask *in_stack_ffffffffffffffc8;
  ValidityMask *mask_00;
  ValidityMask *pVVar5;
  char in_stack_ffffffffffffffd4;
  char in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + in_RCX),in_RDX,(void *)((long)in_RDX + in_RCX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar2) {
    for (uVar4 = 0; uVar4 < in_RCX; uVar4 = uVar4 + 1) {
      cVar3 = BinaryNumericDivideWrapper::
              Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                        ((bool)in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd5,
                         in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
      *(char *)((long)in_RDX + uVar4) = cVar3;
    }
  }
  else {
    mask_00 = (ValidityMask *)0x0;
    idx = TemplatedValidityMask<unsigned_long>::EntryCount(0x133a621);
    for (local_48 = 0; local_48 < idx; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT17(in_stack_ffffffffffffff8f,
                                     CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                            in_stack_ffffffffffffff80);
      local_58 = (ValidityMask *)MinValue<unsigned_long>((unsigned_long)(mask_00 + 2),in_RCX);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar2) {
        for (; pVVar5 = mask_00, mask_00 < local_58;
            mask_00 = (ValidityMask *)
                      ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          local_59 = *in_RDI;
          local_5a = *(undefined1 *)((long)in_RSI + (long)mask_00);
          cVar3 = BinaryNumericDivideWrapper::
                  Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                            ((bool)in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd5,
                             in_stack_ffffffffffffffd4,mask_00,idx);
          *(char *)((long)in_RDX + (long)mask_00) = cVar3;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        pVVar1 = mask_00;
        pVVar5 = local_58;
        if (!bVar2) {
          for (; local_68 = pVVar1, pVVar5 = mask_00, mask_00 < local_58;
              mask_00 = (ValidityMask *)
                        ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1)) {
            local_70 = (long)mask_00 - (long)local_68;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_70);
            if (bVar2) {
              in_stack_ffffffffffffff8f = *in_RDI;
              in_stack_ffffffffffffff8e = *(undefined1 *)((long)in_RSI + (long)mask_00);
              cVar3 = BinaryNumericDivideWrapper::
                      Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                                ((bool)in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd5,
                                 in_stack_ffffffffffffffd4,mask_00,idx);
              *(char *)((long)in_RDX + (long)mask_00) = cVar3;
            }
            pVVar1 = local_68;
          }
        }
      }
      mask_00 = pVVar5;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}